

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_http_conn.c
# Opt level: O2

uo_http_conn * uo_http_conn_create_for_client(uo_http_client *http_client,uo_tcp_conn *tcp_conn)

{
  uo_http_conn *hashtbl;
  uo_buf puVar1;
  
  hashtbl = (uo_http_conn *)calloc(1,0x1b0);
  (hashtbl->field_4).http_client = http_client;
  hashtbl->evt_handlers = &http_client->evt_handlers;
  hashtbl->tcp_conn = tcp_conn;
  puVar1 = uo_buf_alloc(0x200);
  hashtbl->buf = puVar1;
  uo_strhashtbl_create_at((uo_strhashtbl *)hashtbl,0);
  uo_strhashtbl_create_at(&hashtbl->req_data,0);
  uo_http_msg_create_at
            (&hashtbl->http_req,&hashtbl->buf,UO_HTTP_MSG_TYPE_REQUEST,UO_HTTP_MSG_ROLE_SEND);
  uo_http_msg_create_at
            (&hashtbl->http_res,&tcp_conn->rbuf,UO_HTTP_MSG_TYPE_RESPONSE,UO_HTTP_MSG_ROLE_RECV);
  return hashtbl;
}

Assistant:

uo_http_conn *uo_http_conn_create_for_client(
    uo_http_client *http_client,
    uo_tcp_conn *tcp_conn)
{
    uo_http_conn *http_conn = calloc(1, sizeof *http_conn);
    http_conn->http_client = http_client;
    http_conn->evt_handlers = &http_client->evt_handlers;
    http_conn->tcp_conn = tcp_conn;

    http_conn->buf = uo_buf_alloc(0x200);

    uo_strhashtbl_create_at(&http_conn->user_data, 0);
    uo_strhashtbl_create_at(&http_conn->req_data, 0);

    uo_http_msg_create_at(&http_conn->http_req, &http_conn->buf, 
        UO_HTTP_MSG_TYPE_REQUEST, UO_HTTP_MSG_ROLE_SEND);
    uo_http_msg_create_at(&http_conn->http_res, &tcp_conn->rbuf, 
        UO_HTTP_MSG_TYPE_RESPONSE, UO_HTTP_MSG_ROLE_RECV);

    return http_conn;
}